

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O0

void __thiscall
glcts::ViewportArray::DrawTestBase::prepareTextureD32F(DrawTestBase *this,texture *texture)

{
  uint uStack_1001c;
  undefined4 uStack_10018;
  GLuint i;
  GLfloat data [16384];
  texture *texture_local;
  DrawTestBase *this_local;
  
  for (uStack_1001c = 0; uStack_1001c < 0x4000; uStack_1001c = uStack_1001c + 1) {
    (&uStack_10018)[uStack_1001c] = 0xbf800000;
  }
  Utils::texture::create(texture,0x80,0x80,0x8cac);
  Utils::texture::update(texture,0x80,0x80,0,0x1902,0x1406,&uStack_10018);
  return;
}

Assistant:

void DrawTestBase::prepareTextureD32F(Utils::texture& texture)
{
	static const GLuint size = m_width * m_height;
	GLfloat				data[size];

	for (GLuint i = 0; i < size; ++i)
	{
		data[i] = -1.0f;
	}

	texture.create(m_width, m_height, GL_DEPTH_COMPONENT32F);
	texture.update(m_width, m_height, 0 /* depth */, GL_DEPTH_COMPONENT, GL_FLOAT, data);
}